

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_dump_header(mcpl_file_t f)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  mcpl_fileinternal_t *f_1;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  uint i;
  uint32_t ldata;
  char *data;
  uint local_3c;
  char *local_38;
  
  puts("\n  Basic info");
  printf("    Format             : MCPL-%i\n",(ulong)*(uint *)((long)f.internal + 0x18));
  printf("    No. of particles   : %lu\n",*(undefined8 *)((long)f.internal + 0x40));
  printf("    Header storage     : %lu bytes\n",*(undefined8 *)((long)f.internal + 0x80));
  printf("    Data storage       : %lu bytes\n",
         (long)*(int *)((long)f.internal + 0x78) * *(long *)((long)f.internal + 0x40));
  puts("\n  Custom meta data");
  printf("    Source             : \"%s\"\n",*(undefined8 *)((long)f.internal + 0x10));
  uVar1 = *(uint *)((long)f.internal + 0x48);
  printf("    Number of comments : %i\n",(ulong)uVar1);
  if (uVar1 != 0) {
    i = 0;
    do {
      pcVar4 = mcpl_hdr_comment(f,i);
      printf("          -> comment %i : \"%s\"\n",(ulong)i,pcVar4);
      i = i + 1;
    } while (uVar1 != i);
  }
  uVar6 = (ulong)*(uint *)((long)f.internal + 0x58);
  printf("    Number of blobs    : %i\n",uVar6);
  if (uVar6 != 0) {
    lVar2 = *(long *)((long)f.internal + 0x60);
    uVar5 = 0;
    do {
      pcVar4 = *(char **)(lVar2 + uVar5 * 8);
      iVar3 = mcpl_hdr_blob(f,pcVar4,&local_3c,&local_38);
      if (iVar3 == 0) {
        (*mcpl_error_handler)("Unexpected blob access error");
        printf("MCPL ERROR: %s\n",
               "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
              );
        exit(1);
      }
      printf("          -> %lu bytes of data with key \"%s\"\n",(ulong)local_3c,pcVar4);
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  puts("\n  Particle data format");
  pcVar7 = "yes";
  pcVar4 = "yes";
  if (*(int *)((long)f.internal + 0x1c) == 0) {
    pcVar4 = "no";
  }
  printf("    User flags         : %s\n",pcVar4);
  if (*(int *)((long)f.internal + 0x20) == 0) {
    pcVar7 = "no";
  }
  printf("    Polarisation info  : %s\n",pcVar7);
  printf("    Fixed part. type   : ");
  if (*(int *)((long)f.internal + 0x28) == 0) {
    puts("no");
  }
  else {
    printf("yes (pdgcode %li)\n");
  }
  printf("    Fixed part. weight : ");
  if ((*(double *)((long)f.internal + 0x30) != 0.0) || (NAN(*(double *)((long)f.internal + 0x30))))
  {
    printf("yes (weight %g)\n");
  }
  else {
    puts("no");
  }
  pcVar4 = "single";
  if (*(int *)((long)f.internal + 0x24) == 0) {
    pcVar4 = "double";
  }
  printf("    FP precision       : %s\n",pcVar4);
  pcVar4 = "little";
  if (*(int *)((long)f.internal + 0x38) == 0) {
    pcVar4 = "big";
  }
  printf("    Endianness         : %s\n",pcVar4);
  printf("    Storage            : %i bytes/particle\n",(ulong)*(uint *)((long)f.internal + 0x78));
  putchar(10);
  return;
}

Assistant:

void mcpl_dump_header(mcpl_file_t f)
{
  printf("\n  Basic info\n");
  printf("    Format             : MCPL-%i\n",mcpl_hdr_version(f));
  printf("    No. of particles   : %" PRIu64 "\n",mcpl_hdr_nparticles(f));
  printf("    Header storage     : %" PRIu64 " bytes\n",mcpl_hdr_header_size(f));
  printf("    Data storage       : %" PRIu64 " bytes\n",mcpl_hdr_nparticles(f)*mcpl_hdr_particle_size(f));
  printf("\n  Custom meta data\n");
  printf("    Source             : \"%s\"\n",mcpl_hdr_srcname(f));
  unsigned nc=mcpl_hdr_ncomments(f);
  printf("    Number of comments : %i\n",nc);
  unsigned ic;
  for (ic = 0; ic < nc; ++ic)
    printf("          -> comment %i : \"%s\"\n",ic,mcpl_hdr_comment(f,ic));
  unsigned nb = mcpl_hdr_nblobs(f);
  printf("    Number of blobs    : %i\n",nb);
  const char** blobkeys = mcpl_hdr_blobkeys(f);
  uint32_t ib;
  for (ib = 0; ib < nb; ++ib) {
    const char * data;
    uint32_t ldata;
    int ok = mcpl_hdr_blob(f, blobkeys[ib], &ldata, &data);
    if (!ok)
      mcpl_error("Unexpected blob access error");
    printf("          -> %lu bytes of data with key \"%s\"\n",(unsigned long)ldata,blobkeys[ib]);
  }

  printf("\n  Particle data format\n");
  printf("    User flags         : %s\n",(mcpl_hdr_has_userflags(f)?"yes":"no"));
  printf("    Polarisation info  : %s\n",(mcpl_hdr_has_polarisation(f)?"yes":"no"));
  printf("    Fixed part. type   : ");
  int32_t updg = mcpl_hdr_universal_pdgcode(f);
  if (updg)
    printf("yes (pdgcode %li)\n",(long)updg);
  else
    printf("no\n");
  printf("    Fixed part. weight : ");
  double uw = mcpl_hdr_universal_weight(f);
  if (uw)
    printf("yes (weight %g)\n",uw);
  else
    printf("no\n");
  printf("    FP precision       : %s\n",(mcpl_hdr_has_doubleprec(f)?"double":"single"));
  printf("    Endianness         : %s\n",(mcpl_hdr_little_endian(f)?"little":"big"));
  printf("    Storage            : %i bytes/particle\n",mcpl_hdr_particle_size(f));

  printf("\n");
}